

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.h
# Opt level: O0

void __thiscall tetgenmesh::tspivot(tetgenmesh *this,triface *t,face *s)

{
  face *s_local;
  triface *t_local;
  tetgenmesh *this_local;
  
  if (t->tet[9] == (tetrahedron)0x0) {
    s->sh = (shellface *)0x0;
  }
  else {
    sdecode(this,(shellface)t->tet[9][(int)(t->ver & 3)],s);
    s->shver = tspivottbl[t->ver][s->shver];
  }
  return;
}

Assistant:

inline void tetgenmesh::tspivot(triface& t, face& s) 
{
  if ((t).tet[9] == NULL) {
    (s).sh = NULL;
    return;
  }
  // Get the attached subface s.
  sdecode(((shellface *) (t).tet[9])[(t).ver & 3], (s));
  (s).shver = tspivottbl[t.ver][s.shver];
}